

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Lf_Cut_t * Lf_ManFetchSet(Lf_Man_t *p,int i)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  void *pvVar5;
  
  pObj = Gia_ManObj(p->pGia,i);
  iVar1 = Vec_IntEntry(&p->vOffsets,i);
  p_00 = &p->vCutSets;
  uVar2 = Vec_IntEntry(p_00,iVar1);
  iVar3 = Gia_ObjIsAndNotBuf(pObj);
  if (iVar3 == 0) {
    __assert_fail("Gia_ObjIsAndNotBuf(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x171,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
  }
  if (pObj->Value != 0) {
    if (uVar2 == 0xffffffff) {
      iVar3 = (p->vFreeSets).nSize;
      if (iVar3 == 0) {
        pvVar5 = calloc((long)p->nSetWords << 0xc,8);
        iVar3 = (p->vMemSets).nSize;
        Vec_PtrPush(&p->vMemSets,pvVar5);
        for (uVar2 = 0xfff; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
          Vec_IntPush(&p->vFreeSets,uVar2 | iVar3 << 0xc);
          *(undefined1 *)((long)pvVar5 + (ulong)uVar2 * 0x18 + 0x17) = 0xff;
        }
        iVar3 = (p->vFreeSets).nSize;
      }
      if (iVar3 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      (p->vFreeSets).nSize = iVar3 - 1U;
      uVar2 = (p->vFreeSets).pArray[iVar3 - 1U];
      Vec_IntWriteEntry(p_00,iVar1,uVar2);
      iVar1 = uVar2 + 1;
      if ((int)(uVar2 + 1) < p->nFrontMax) {
        iVar1 = p->nFrontMax;
      }
      p->nFrontMax = iVar1;
    }
    else {
      uVar4 = pObj->Value - 1;
      pObj->Value = uVar4;
      if (uVar4 == 0) {
        Vec_IntPush(&p->vFreeSets,uVar2);
        Vec_IntWriteEntry(p_00,iVar1,-1);
      }
    }
    pvVar5 = Vec_PtrEntry(&p->vMemSets,(int)uVar2 >> 0xc);
    return (Lf_Cut_t *)((long)pvVar5 + (ulong)(uVar2 & 0xfff) * (long)p->nSetWords * 8);
  }
  __assert_fail("pObj->Value > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                ,0x172,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
}

Assistant:

static inline Lf_Cut_t * Lf_ManFetchSet( Lf_Man_t * p, int i )
{
    int uMaskPage = (1 << LF_LOG_PAGE) - 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, i );
    int iOffSet = Vec_IntEntry( &p->vOffsets, i );
    int Entry = Vec_IntEntry( &p->vCutSets, iOffSet );
    assert( Gia_ObjIsAndNotBuf(pObj) );
    assert( pObj->Value > 0 );
    if ( Entry == -1 ) // first visit
    {
        if ( Vec_IntSize(&p->vFreeSets) == 0 ) // add new
        {
            Lf_Cut_t * pCut = (Lf_Cut_t *)ABC_CALLOC( word, p->nSetWords * (1 << LF_LOG_PAGE) );
            int uMaskShift = Vec_PtrSize(&p->vMemSets) << LF_LOG_PAGE;
            Vec_PtrPush( &p->vMemSets, pCut );
            for ( Entry = uMaskPage; Entry >= 0; Entry-- )
            {
                Vec_IntPush( &p->vFreeSets, uMaskShift | Entry );
                pCut[Entry].nLeaves   = LF_NO_LEAF;
            }
        }
        Entry = Vec_IntPop( &p->vFreeSets );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, Entry );
        p->nFrontMax = Abc_MaxInt( p->nFrontMax, Entry + 1 );
    }
    else if ( --pObj->Value == 0 )
    {
        Vec_IntPush( &p->vFreeSets, Entry );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, -1 );
    }
    return (Lf_Cut_t *)((word *)Vec_PtrEntry(&p->vMemSets, Entry >> LF_LOG_PAGE) + p->nSetWords * (Entry & uMaskPage));
}